

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O1

int WebPPictureAlloc(WebPPicture *picture)

{
  int height;
  int iVar1;
  
  if (picture == (WebPPicture *)0x0) {
    return 1;
  }
  iVar1 = picture->width;
  height = picture->height;
  WebPSafeFree(picture->memory_);
  WebPSafeFree(picture->memory_argb_);
  picture->argb = (uint32_t *)0x0;
  picture->argb_stride = 0;
  picture->y = (uint8_t *)0x0;
  picture->u = (uint8_t *)0x0;
  picture->v = (uint8_t *)0x0;
  picture->y_stride = 0;
  picture->uv_stride = 0;
  *(undefined8 *)&picture->uv_stride = 0;
  *(undefined8 *)((long)&picture->a + 4) = 0;
  picture->memory_ = (void *)0x0;
  picture->memory_argb_ = (void *)0x0;
  if (picture->use_argb != 0) {
    iVar1 = WebPPictureAllocARGB(picture,iVar1,height);
    return iVar1;
  }
  iVar1 = WebPPictureAllocYUVA(picture,iVar1,height);
  return iVar1;
}

Assistant:

int WebPPictureAlloc(WebPPicture* picture) {
  if (picture != NULL) {
    const int width = picture->width;
    const int height = picture->height;

    WebPPictureFree(picture);   // erase previous buffer

    if (!picture->use_argb) {
      return WebPPictureAllocYUVA(picture, width, height);
    } else {
      return WebPPictureAllocARGB(picture, width, height);
    }
  }
  return 1;
}